

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<char_const(&)[1]>::operator==
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[1]> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  lest *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator<char> local_69;
  string local_68;
  string local_48 [32];
  
  bVar1 = std::operator==(*(char **)this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"==",&local_69);
  to_string<char[1],std::__cxx11::string>(&local_68,this_00,(char (*) [1])local_48,rhs,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }